

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poisson.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<const_char_*const> init_list;
  initializer_list<const_char_*const> init_list_00;
  initializer_list<const_char_*const> init_list_01;
  initializer_list<const_char_*const> init_list_02;
  initializer_list<const_char_*const> init_list_03;
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  _Setprecision _Var5;
  ulong uVar6;
  char *FileName;
  ostream *poVar7;
  pointer pPVar8;
  size_type sVar9;
  reference pPVar10;
  undefined8 in_R8;
  undefined4 in_R9D;
  float fVar11;
  Point center;
  Point center_00;
  int *local_668;
  int *local_660;
  Point *p_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *__range2_1;
  Point *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *__range2;
  ofstream File;
  int Base;
  float P;
  float R;
  int y;
  int x;
  __normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
  local_3c0;
  const_iterator i;
  uchar *Img;
  size_t DataSize;
  Point local_394;
  Point local_388;
  Point local_374;
  undefined1 local_368 [8];
  vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> Points;
  DefaultPRNG PRNG;
  string_stream local_328;
  uint local_1a4;
  char *pcStack_1a0;
  uint numPoints;
  iterator local_198;
  undefined8 local_190;
  byte local_181;
  char *pcStack_180;
  bool cmdHammersley;
  iterator local_178;
  undefined8 local_170;
  byte local_161;
  char *pcStack_160;
  bool cmdJitteredGrid;
  iterator local_158;
  undefined8 local_150;
  byte local_141;
  char *pcStack_140;
  bool cmdVogelDisk;
  iterator local_138;
  undefined8 local_130;
  byte local_121;
  char *pcStack_120;
  bool cmdSquare;
  iterator local_118;
  undefined8 local_110;
  byte local_105;
  bool cmdRawPointsOutput;
  undefined1 local_f8 [8];
  parser cmdl;
  char **argv_local;
  int argc_local;
  
  cmdl._216_8_ = argv;
  PrintBanner();
  argh::parser::parser((parser *)local_f8,(char **)cmdl._216_8_,1);
  argh::parser::operator[][abi_cxx11_((parser *)local_f8,1);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    argh::parser::operator[][abi_cxx11_((parser *)local_f8,1);
    FileName = (char *)std::__cxx11::string::c_str();
    LoadDensityMap(FileName);
  }
  pcStack_120 = "--raw-points";
  local_118 = &stack0xfffffffffffffee0;
  local_110 = 1;
  init_list_03._M_len = 1;
  init_list_03._M_array = local_118;
  local_105 = argh::parser::operator[]((parser *)local_f8,init_list_03);
  pcStack_140 = "--square";
  local_138 = &stack0xfffffffffffffec0;
  local_130 = 1;
  init_list_02._M_len = 1;
  init_list_02._M_array = local_138;
  local_121 = argh::parser::operator[]((parser *)local_f8,init_list_02);
  pcStack_160 = "--vogel-disk";
  local_158 = &stack0xfffffffffffffea0;
  local_150 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_158;
  local_141 = argh::parser::operator[]((parser *)local_f8,init_list_01);
  pcStack_180 = "--jittered-grid";
  local_178 = &stack0xfffffffffffffe80;
  local_170 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_178;
  local_161 = argh::parser::operator[]((parser *)local_f8,init_list_00);
  pcStack_1a0 = "--hammersley";
  local_198 = &stack0xfffffffffffffe60;
  local_190 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_198;
  local_181 = argh::parser::operator[]((parser *)local_f8,init_list);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&PRNG,"num-points",
             (allocator *)
             ((long)&Points.
                     super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if ((local_141 & 1) == 0) {
    if ((local_161 & 1) == 0) {
      local_668 = &kNumPointsDefaultPoisson;
    }
    else {
      local_668 = &kNumPointsDefaultJittered;
    }
    local_660 = local_668;
  }
  else {
    local_660 = &kNumPointsDefaultVogel;
  }
  argh::parser::operator()(&local_328,(parser *)local_f8,(string *)&PRNG,local_660);
  argh::stringstream_proxy::operator>>(&local_328,&local_1a4);
  argh::stringstream_proxy::~stringstream_proxy(&local_328);
  std::__cxx11::string::~string((string *)&PRNG);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&Points.
                     super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  poVar7 = std::operator<<((ostream *)&std::cout,"NumPoints = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1a4);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  PoissonGenerator::DefaultPRNG::DefaultPRNG
            ((DefaultPRNG *)
             &Points.
              super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((local_141 & 1) == 0) {
    if ((local_161 & 1) == 0) {
      if ((local_181 & 1) == 0) {
        PoissonGenerator::generatePoissonPoints<PoissonGenerator::DefaultPRNG>
                  ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                   local_368,local_1a4,
                   (DefaultPRNG *)
                   &Points.
                    super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool)(~local_121 & 1),0x1e,
                   -1.0);
      }
      else {
        PoissonGenerator::generateHammersleyPoints
                  ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                   local_368,local_1a4);
      }
    }
    else {
      bVar1 = local_121 ^ 1;
      PoissonGenerator::Point::Point(&local_394,0.5,0.5);
      center_00._8_4_ = in_R9D;
      center_00.x = local_394.x;
      center_00.y = local_394.y;
      PoissonGenerator::generateJitteredGridPoints<PoissonGenerator::DefaultPRNG>
                ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                 local_368,(PoissonGenerator *)(ulong)local_1a4,(int)&Points + 0x10,
                 (DefaultPRNG *)(ulong)(bVar1 & 1),local_394.valid_,0.004,center_00);
    }
  }
  else {
    PoissonGenerator::Point::Point(&local_374,0.5,0.5);
    local_388.valid_ = local_374.valid_;
    local_388._9_3_ = local_374._9_3_;
    local_388.x = local_374.x;
    local_388.y = local_374.y;
    center._8_4_ = (undefined4)in_R8;
    center.x = local_374.x;
    center.y = local_374.y;
    PoissonGenerator::generateVogelPoints
              ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
               local_368,(PoissonGenerator *)(ulong)local_1a4,1,local_374.valid_,0.0,center);
  }
  i._M_current = (Point *)operator_new__(0xc0000);
  memset(i._M_current,0,0xc0000);
  local_3c0._M_current =
       (Point *)std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::
                begin((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                      local_368);
  while( true ) {
    _y = std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::end
                   ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                    local_368);
    bVar2 = __gnu_cxx::operator!=
                      (&local_3c0,
                       (__normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
                        *)&y);
    if (!bVar2) break;
    pPVar8 = __gnu_cxx::
             __normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
             ::operator->(&local_3c0);
    iVar3 = (int)(pPVar8->x * 512.0);
    pPVar8 = __gnu_cxx::
             __normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
             ::operator->(&local_3c0);
    iVar4 = (int)(pPVar8->y * 512.0);
    if ((((-1 < iVar3) && (-1 < iVar4)) && (iVar3 < 0x200)) &&
       ((iVar4 < 0x200 &&
        ((g_DensityMap == (float *)0x0 ||
         (fVar11 = PoissonGenerator::DefaultPRNG::randomFloat
                             ((DefaultPRNG *)
                              &Points.
                               super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
         fVar11 <= g_DensityMap[iVar3 + iVar4 * 0x200])))))) {
      iVar3 = (iVar3 + iVar4 * 0x200) * 3;
      *(undefined1 *)((long)&(i._M_current)->x + (long)(iVar3 + 2)) = 0xff;
      *(undefined1 *)((long)&(i._M_current)->x + (long)(iVar3 + 1)) = 0xff;
      *(undefined1 *)((long)&(i._M_current)->x + (long)iVar3) = 0xff;
    }
    __gnu_cxx::
    __normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
    ::operator++(&local_3c0,0);
  }
  SaveBMP("Points.bmp",i._M_current,0x200,0x200);
  if (i._M_current != (Point *)0x0) {
    operator_delete__(i._M_current);
  }
  std::ofstream::ofstream(&__range2,"points.txt",_S_out);
  if ((local_105 & 1) == 0) {
    poVar7 = std::operator<<((ostream *)&__range2,"const vec2 points[");
    sVar9 = std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::size
                      ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                       local_368);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar9);
    poVar7 = std::operator<<(poVar7,"]");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&__range2,"{");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&__range2,std::fixed);
    _Var5 = std::setprecision(6);
    std::operator<<(poVar7,_Var5);
    __end2_1 = std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::begin
                         ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                           *)local_368);
    p_1 = (Point *)std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::
                   end((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                       local_368);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
                               *)&p_1), bVar2) {
      pPVar10 = __gnu_cxx::
                __normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
                ::operator*(&__end2_1);
      poVar7 = std::operator<<((ostream *)&__range2,"\tvec2(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar10->x);
      poVar7 = std::operator<<(poVar7,"f, ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar10->y);
      poVar7 = std::operator<<(poVar7,"f),");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
      ::operator++(&__end2_1);
    }
    poVar7 = std::operator<<((ostream *)&__range2,"};");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar7 = std::operator<<((ostream *)&__range2,"NumPoints = ");
    sVar9 = std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::size
                      ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                       local_368);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    __end2 = std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::begin
                       ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *
                        )local_368);
    p = (Point *)std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::end
                           ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                             *)local_368);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
                                       *)&p), bVar2) {
      pPVar10 = __gnu_cxx::
                __normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
                ::operator*(&__end2);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&__range2,pPVar10->x);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar10->y);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<const_PoissonGenerator::Point_*,_std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>_>
      ::operator++(&__end2);
    }
  }
  std::ofstream::~ofstream(&__range2);
  std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::~vector
            ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)local_368)
  ;
  argh::parser::~parser((parser *)local_f8);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  PrintBanner();

  argh::parser cmdl(argv);

  if (!cmdl[1].empty()) {
    LoadDensityMap(cmdl[1].c_str());
  }

  const bool cmdRawPointsOutput = cmdl[{"--raw-points"}];
  const bool cmdSquare = cmdl[{"--square"}];
  const bool cmdVogelDisk = cmdl[{"--vogel-disk"}];
  const bool cmdJitteredGrid = cmdl[{"--jittered-grid"}];
  ;
  const bool cmdHammersley = cmdl[{"--hammersley"}];
  ;

  unsigned int numPoints;
  cmdl("num-points", cmdVogelDisk ? kNumPointsDefaultVogel : (cmdJitteredGrid ? kNumPointsDefaultJittered : kNumPointsDefaultPoisson)) >>
      numPoints;

  std::cout << "NumPoints = " << numPoints << std::endl;

  PoissonGenerator::DefaultPRNG PRNG;

  const auto Points = cmdVogelDisk      ? PoissonGenerator::generateVogelPoints(numPoints)
                      : cmdJitteredGrid ? PoissonGenerator::generateJitteredGridPoints(numPoints, PRNG, !cmdSquare)
                      : cmdHammersley   ? PoissonGenerator::generateHammersleyPoints(numPoints)
                                        : PoissonGenerator::generatePoissonPoints(numPoints, PRNG, !cmdSquare);

  // prepare BGR image
  const size_t DataSize = 3 * kImageSize * kImageSize;

  unsigned char* Img = new unsigned char[DataSize];

  memset(Img, 0, DataSize);

  for (auto i = Points.begin(); i != Points.end(); i++) {
    int x = int(i->x * kImageSize);
    int y = int(i->y * kImageSize);
    if (x < 0 || y < 0 || x >= kImageSize || y >= kImageSize)
      continue;
    if (g_DensityMap) {
      // dice
      float R = PRNG.randomFloat();
      float P = g_DensityMap[x + y * kImageSize];
      if (R > P)
        continue;
    }
    int Base = 3 * (x + y * kImageSize);
    Img[Base + 0] = Img[Base + 1] = Img[Base + 2] = 255;
  }

  SaveBMP("Points.bmp", Img, kImageSize, kImageSize);

  delete[] (Img);

  // dump points to a text file
  std::ofstream File("points.txt", std::ios::out);

  if (cmdRawPointsOutput) {
    File << "NumPoints = " << Points.size() << std::endl;

    for (const auto& p : Points) {
      File << p.x << " " << p.y << std::endl;
    }
  } else {
    File << "const vec2 points[" << Points.size() << "]" << std::endl;
    File << "{" << std::endl;
    File << std::fixed << std::setprecision(6);
    for (const auto& p : Points) {
      File << "\tvec2(" << p.x << "f, " << p.y << "f)," << std::endl;
    }
    File << "};" << std::endl;
  }

  return 0;
}